

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btMultiBody.cpp
# Opt level: O0

void __thiscall
btMultiBody::setupSpherical
          (btMultiBody *this,int i,btScalar mass,btVector3 *inertia,int parent,
          btQuaternion *rotParentToThis,btVector3 *parentComToThisPivotOffset,
          btVector3 *thisPivotToThisComOffset,bool disableParentCollision)

{
  undefined8 uVar1;
  btMultiBodyLinkCollider *pbVar2;
  btScalar bVar3;
  btMultibodyLink *pbVar4;
  btMultibodyLink *pbVar5;
  btMultibodyLink *this_00;
  int in_ECX;
  btScalar *in_RDX;
  int in_ESI;
  long in_RDI;
  btAlignedObjectArray<btMultibodyLink> *this_01;
  btMultibodyLink *in_R8;
  btMultiBody *in_R9;
  btScalar in_XMM0_Da;
  btVector3 bVar6;
  undefined8 *in_stack_00000008;
  byte in_stack_00000010;
  btScalar *in_stack_00000128;
  btMultibodyLink *in_stack_00000130;
  undefined4 in_stack_ffffffffffffff08;
  undefined4 in_stack_ffffffffffffff18;
  int iVar7;
  btMultiBody *this_02;
  btVector3 local_88;
  btVector3 local_78;
  btVector3 local_68;
  undefined4 local_58;
  undefined4 local_54;
  undefined4 local_50;
  undefined4 local_4c;
  undefined4 local_48;
  undefined4 local_44;
  undefined4 local_40;
  undefined4 local_3c;
  undefined4 local_38;
  byte local_31;
  btMultiBody *local_30;
  btMultibodyLink *local_28;
  int local_1c;
  btScalar *local_18;
  int local_c;
  
  local_31 = in_stack_00000010 & 1;
  *(int *)(in_RDI + 0x234) = *(int *)(in_RDI + 0x234) + 3;
  *(int *)(in_RDI + 0x238) = *(int *)(in_RDI + 0x238) + 4;
  this_01 = (btAlignedObjectArray<btMultibodyLink> *)(in_RDI + 0x90);
  local_30 = in_R9;
  local_28 = in_R8;
  local_1c = in_ECX;
  local_18 = in_RDX;
  local_c = in_ESI;
  pbVar4 = btAlignedObjectArray<btMultibodyLink>::operator[](this_01,in_ESI);
  pbVar4->m_mass = in_XMM0_Da;
  pbVar4 = btAlignedObjectArray<btMultibodyLink>::operator[](this_01,local_c);
  uVar1 = *(undefined8 *)(local_18 + 2);
  *(undefined8 *)(pbVar4->m_inertiaLocal).m_floats = *(undefined8 *)local_18;
  *(undefined8 *)((pbVar4->m_inertiaLocal).m_floats + 2) = uVar1;
  pbVar4 = btAlignedObjectArray<btMultibodyLink>::operator[](this_01,local_c);
  pbVar4->m_parent = local_1c;
  pbVar4 = btAlignedObjectArray<btMultibodyLink>::operator[](this_01,local_c);
  bVar3 = (local_28->m_inertiaLocal).m_floats[0];
  uVar1 = *(undefined8 *)((local_28->m_inertiaLocal).m_floats + 1);
  (pbVar4->m_zeroRotParentToThis).super_btQuadWord.m_floats[0] = local_28->m_mass;
  (pbVar4->m_zeroRotParentToThis).super_btQuadWord.m_floats[1] = bVar3;
  *(undefined8 *)((pbVar4->m_zeroRotParentToThis).super_btQuadWord.m_floats + 2) = uVar1;
  pbVar4 = btAlignedObjectArray<btMultibodyLink>::operator[](this_01,local_c);
  uVar1 = in_stack_00000008[1];
  *(undefined8 *)(pbVar4->m_dVector).m_floats = *in_stack_00000008;
  *(undefined8 *)((pbVar4->m_dVector).m_floats + 2) = uVar1;
  pbVar4 = btAlignedObjectArray<btMultibodyLink>::operator[](this_01,local_c);
  pbVar2 = local_30->m_baseCollider;
  *(_func_int ***)(pbVar4->m_eVector).m_floats = local_30->_vptr_btMultiBody;
  *(btMultiBodyLinkCollider **)((pbVar4->m_eVector).m_floats + 2) = pbVar2;
  pbVar4 = btAlignedObjectArray<btMultibodyLink>::operator[](this_01,local_c);
  pbVar4->m_jointType = eSpherical;
  pbVar4 = btAlignedObjectArray<btMultibodyLink>::operator[](this_01,local_c);
  pbVar4->m_dofCount = 3;
  pbVar4 = btAlignedObjectArray<btMultibodyLink>::operator[](this_01,local_c);
  pbVar4->m_posVarCount = 4;
  btAlignedObjectArray<btMultibodyLink>::operator[](this_01,local_c);
  local_38 = 0x3f800000;
  local_3c = 0;
  local_40 = 0;
  btMultibodyLink::setAxisTop
            (local_28,local_1c,local_18,(btScalar *)CONCAT44(in_XMM0_Da,in_stack_ffffffffffffff08),
             (btScalar *)0x238246);
  btAlignedObjectArray<btMultibodyLink>::operator[](this_01,local_c);
  local_44 = 0;
  local_48 = 0x3f800000;
  local_4c = 0;
  btMultibodyLink::setAxisTop
            (local_28,local_1c,local_18,(btScalar *)CONCAT44(in_XMM0_Da,in_stack_ffffffffffffff08),
             (btScalar *)0x2382a1);
  btAlignedObjectArray<btMultibodyLink>::operator[](this_01,local_c);
  local_50 = 0;
  local_54 = 0;
  local_58 = 0x3f800000;
  btMultibodyLink::setAxisTop
            (local_28,local_1c,local_18,(btScalar *)CONCAT44(in_XMM0_Da,in_stack_ffffffffffffff08),
             (btScalar *)0x2382fc);
  pbVar4 = btAlignedObjectArray<btMultibodyLink>::operator[](this_01,local_c);
  pbVar5 = btAlignedObjectArray<btMultibodyLink>::operator[](this_01,local_c);
  btMultibodyLink::getAxisTop(pbVar5,0);
  bVar6 = btVector3::cross((btVector3 *)local_28,
                           (btVector3 *)CONCAT44(local_1c,in_stack_ffffffffffffff18));
  local_68.m_floats._8_8_ = bVar6.m_floats._8_8_;
  local_68.m_floats._0_8_ = bVar6.m_floats._0_8_;
  btMultibodyLink::setAxisBottom(pbVar4,0,&local_68);
  pbVar4 = btAlignedObjectArray<btMultibodyLink>::operator[](this_01,local_c);
  pbVar5 = btAlignedObjectArray<btMultibodyLink>::operator[](this_01,local_c);
  btMultibodyLink::getAxisTop(pbVar5,1);
  bVar6 = btVector3::cross((btVector3 *)local_28,
                           (btVector3 *)CONCAT44(local_1c,in_stack_ffffffffffffff18));
  local_78.m_floats._8_8_ = bVar6.m_floats._8_8_;
  local_78.m_floats._0_8_ = bVar6.m_floats._0_8_;
  btMultibodyLink::setAxisBottom(pbVar4,1,&local_78);
  pbVar5 = btAlignedObjectArray<btMultibodyLink>::operator[](this_01,local_c);
  iVar7 = local_1c;
  pbVar4 = local_28;
  this_02 = local_30;
  this_00 = btAlignedObjectArray<btMultibodyLink>::operator[](this_01,local_c);
  btMultibodyLink::getAxisTop(this_00,2);
  bVar6 = btVector3::cross((btVector3 *)pbVar4,
                           (btVector3 *)CONCAT44(iVar7,in_stack_ffffffffffffff18));
  local_88.m_floats._8_8_ = bVar6.m_floats._8_8_;
  local_88.m_floats._0_8_ = bVar6.m_floats._0_8_;
  btMultibodyLink::setAxisBottom(pbVar5,2,&local_88);
  pbVar4 = btAlignedObjectArray<btMultibodyLink>::operator[]
                     ((btAlignedObjectArray<btMultibodyLink> *)(in_RDI + 0x90),local_c);
  pbVar4->m_jointPos[2] = 0.0;
  pbVar4 = btAlignedObjectArray<btMultibodyLink>::operator[]
                     ((btAlignedObjectArray<btMultibodyLink> *)(in_RDI + 0x90),local_c);
  pbVar4->m_jointPos[1] = 0.0;
  pbVar4 = btAlignedObjectArray<btMultibodyLink>::operator[]
                     ((btAlignedObjectArray<btMultibodyLink> *)(in_RDI + 0x90),local_c);
  pbVar4->m_jointPos[0] = 0.0;
  pbVar4 = btAlignedObjectArray<btMultibodyLink>::operator[]
                     ((btAlignedObjectArray<btMultibodyLink> *)(in_RDI + 0x90),local_c);
  pbVar4->m_jointPos[3] = 1.0;
  pbVar4 = btAlignedObjectArray<btMultibodyLink>::operator[]
                     ((btAlignedObjectArray<btMultibodyLink> *)(in_RDI + 0x90),local_c);
  pbVar4->m_jointTorque[2] = 0.0;
  pbVar4 = btAlignedObjectArray<btMultibodyLink>::operator[]
                     ((btAlignedObjectArray<btMultibodyLink> *)(in_RDI + 0x90),local_c);
  pbVar4->m_jointTorque[1] = 0.0;
  pbVar4 = btAlignedObjectArray<btMultibodyLink>::operator[]
                     ((btAlignedObjectArray<btMultibodyLink> *)(in_RDI + 0x90),local_c);
  pbVar4->m_jointTorque[0] = 0.0;
  if ((local_31 & 1) != 0) {
    pbVar4 = btAlignedObjectArray<btMultibodyLink>::operator[]
                       ((btAlignedObjectArray<btMultibodyLink> *)(in_RDI + 0x90),local_c);
    pbVar4->m_flags = pbVar4->m_flags | 1;
  }
  btAlignedObjectArray<btMultibodyLink>::operator[]
            ((btAlignedObjectArray<btMultibodyLink> *)(in_RDI + 0x90),local_c);
  btMultibodyLink::updateCacheMultiDof(in_stack_00000130,in_stack_00000128);
  updateLinksDofOffsets(this_02);
  return;
}

Assistant:

void btMultiBody::setupSpherical(int i,
						   btScalar mass,
						   const btVector3 &inertia,
						   int parent,
						   const btQuaternion &rotParentToThis,
						   const btVector3 &parentComToThisPivotOffset,
						   const btVector3 &thisPivotToThisComOffset,
						   bool disableParentCollision)
{
	
	m_dofCount += 3;
	m_posVarCnt += 4;

	m_links[i].m_mass = mass;
    m_links[i].m_inertiaLocal = inertia;
    m_links[i].m_parent = parent;
    m_links[i].m_zeroRotParentToThis = rotParentToThis;    
    m_links[i].m_dVector = thisPivotToThisComOffset;
    m_links[i].m_eVector = parentComToThisPivotOffset;    

	m_links[i].m_jointType = btMultibodyLink::eSpherical;
	m_links[i].m_dofCount = 3;
	m_links[i].m_posVarCount = 4;
	m_links[i].setAxisTop(0, 1.f, 0.f, 0.f);
	m_links[i].setAxisTop(1, 0.f, 1.f, 0.f);
	m_links[i].setAxisTop(2, 0.f, 0.f, 1.f);
	m_links[i].setAxisBottom(0, m_links[i].getAxisTop(0).cross(thisPivotToThisComOffset));
	m_links[i].setAxisBottom(1, m_links[i].getAxisTop(1).cross(thisPivotToThisComOffset));
	m_links[i].setAxisBottom(2, m_links[i].getAxisTop(2).cross(thisPivotToThisComOffset));
	m_links[i].m_jointPos[0] = m_links[i].m_jointPos[1] = m_links[i].m_jointPos[2] = 0.f; m_links[i].m_jointPos[3] = 1.f;
	m_links[i].m_jointTorque[0] = m_links[i].m_jointTorque[1] = m_links[i].m_jointTorque[2] = 0.f;


	if (disableParentCollision)
		m_links[i].m_flags |=BT_MULTIBODYLINKFLAGS_DISABLE_PARENT_COLLISION;    
	//
	m_links[i].updateCacheMultiDof();	
	//
	updateLinksDofOffsets();
}